

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkCheckTimestepper(ARKodeMem ark_mem)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((ark_mem->step_init != (ARKTimestepInitFn)0x0) && (ark_mem->step != (ARKTimestepStepFn)0x0))
     && (ark_mem->step_mem != (void *)0x0)) {
    uVar1 = (uint)(ark_mem->step_fullrhs != (ARKTimestepFullRHSFn)0x0);
  }
  return uVar1;
}

Assistant:

booleantype arkCheckTimestepper(ARKodeMem ark_mem)
{
  if ( (ark_mem->step_init    == NULL) ||
       (ark_mem->step         == NULL) ||
       (ark_mem->step_mem     == NULL) ||
       (ark_mem->step_fullrhs == NULL) )
    return(SUNFALSE);
  return(SUNTRUE);
}